

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O1

int __thiscall QSqlTableModel::rowCount(QSqlTableModel *this,QModelIndex *parent)

{
  QSqlTableModelPrivate *this_00;
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  QModelIndex local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((parent->r < 0) || (parent->c < 0)) ||
     (iVar2 = 0, (parent->m).ptr == (QAbstractItemModel *)0x0)) {
    this_00 = *(QSqlTableModelPrivate **)&(this->super_QSqlQueryModel).field_0x8;
    local_30.r = -1;
    local_30.c = -1;
    local_30.i = 0;
    local_30.m.ptr = (QAbstractItemModel *)0x0;
    iVar1 = QSqlQueryModel::rowCount(&this->super_QSqlQueryModel,&local_30);
    iVar2 = QSqlTableModelPrivate::insertCount(this_00,-1);
    iVar2 = iVar2 + iVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QSqlTableModel::rowCount(const QModelIndex &parent) const
{
    Q_D(const QSqlTableModel);

    if (parent.isValid())
        return 0;

    return QSqlQueryModel::rowCount() + d->insertCount();
}